

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-gguf.cpp
# Opt level: O3

bool all_kv_in_other(gguf_context *ctx,gguf_context *other)

{
  gguf_context *pgVar1;
  gguf_context *pgVar2;
  long *plVar3;
  uint uVar4;
  uint uVar5;
  gguf_type gVar6;
  gguf_type gVar7;
  int iVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  char *pcVar12;
  long lVar13;
  void *__s1;
  void *__s2;
  size_t __n;
  long lVar14;
  bool bVar15;
  ulong uVar16;
  string str;
  string str_other;
  allocator<char> local_81;
  gguf_context *local_80;
  long *local_78;
  size_t local_70;
  long local_68 [2];
  gguf_context *local_58;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  uVar4 = gguf_get_n_kv();
  if ((int)uVar4 < 1) {
    bVar15 = true;
  }
  else {
    bVar15 = true;
    uVar16 = 0;
    local_80 = ctx;
    local_58 = other;
    do {
      pgVar2 = local_58;
      pgVar1 = local_80;
      uVar9 = gguf_get_key(local_80,uVar16);
      uVar5 = gguf_find_key(pgVar2,uVar9);
      if ((int)uVar5 < 0) {
LAB_00108540:
        bVar15 = false;
      }
      else {
        gVar6 = gguf_get_kv_type(pgVar1,uVar16);
        uVar5 = uVar5 & 0x7fffffff;
        gVar7 = gguf_get_kv_type(pgVar2,uVar5);
        pgVar1 = local_80;
        if (gVar6 != gVar7) goto LAB_00108540;
        if (gVar6 != GGUF_TYPE_STRING) {
          if (gVar6 == GGUF_TYPE_ARRAY) {
            lVar10 = gguf_get_arr_n(local_80,uVar16);
            lVar11 = gguf_get_arr_n(pgVar2,uVar5);
            if (lVar10 == lVar11) {
              gVar6 = gguf_get_arr_type(pgVar1,uVar16);
              gVar7 = gguf_get_arr_type(pgVar2,uVar5);
              if (gVar6 == gVar7) {
                if (gVar6 == GGUF_TYPE_BOOL) {
                  lVar11 = gguf_get_arr_data(local_80,uVar16);
                  lVar13 = gguf_get_arr_data(pgVar2,uVar5);
                  if (lVar10 != 0) {
                    lVar14 = 0;
                    do {
                      bVar15 = (bool)(bVar15 & (*(char *)(lVar13 + lVar14) == '\0') !=
                                               (*(char *)(lVar11 + lVar14) != '\0'));
                      lVar14 = lVar14 + 1;
                    } while (lVar10 != lVar14);
                  }
                }
                else {
                  if (gVar6 != GGUF_TYPE_STRING) {
                    __s1 = (void *)gguf_get_arr_data(local_80,uVar16);
                    __s2 = (void *)gguf_get_arr_data(pgVar2,uVar5);
                    lVar11 = gguf_type_size(gVar6);
                    __n = lVar11 * lVar10;
                    goto LAB_00108529;
                  }
                  if (lVar10 != 0) {
                    lVar11 = 0;
                    do {
                      pcVar12 = (char *)gguf_get_arr_str(local_80,uVar16,lVar11);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_78,pcVar12,(allocator<char> *)&local_50);
                      pcVar12 = (char *)gguf_get_arr_str(local_58,uVar5,lVar11);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_50,pcVar12,&local_81);
                      plVar3 = local_50;
                      if ((local_70 != local_48) ||
                         ((local_70 != 0 && (iVar8 = bcmp(local_78,local_50,local_70), iVar8 != 0)))
                         ) {
                        bVar15 = false;
                      }
                      if (plVar3 != local_40) {
                        operator_delete(plVar3,local_40[0] + 1);
                      }
                      if (local_78 != local_68) {
                        operator_delete(local_78,local_68[0] + 1);
                      }
                      lVar11 = lVar11 + 1;
                    } while (lVar10 != lVar11);
                  }
                }
                goto LAB_00108547;
              }
            }
          }
          else {
            __s1 = (void *)gguf_get_val_data(local_80,uVar16);
            __s2 = (void *)gguf_get_val_data(pgVar2,uVar5);
            __n = gguf_type_size(gVar6);
LAB_00108529:
            if ((__n == 0) || (iVar8 = bcmp(__s1,__s2,__n), iVar8 == 0)) goto LAB_00108547;
          }
          goto LAB_00108540;
        }
        pcVar12 = (char *)gguf_get_val_str(local_80,uVar16);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,pcVar12,(allocator<char> *)&local_50);
        pcVar12 = (char *)gguf_get_val_str(pgVar2,uVar5);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar12,&local_81);
        plVar3 = local_50;
        if ((local_70 != local_48) ||
           ((local_70 != 0 && (iVar8 = bcmp(local_78,local_50,local_70), iVar8 != 0)))) {
          bVar15 = false;
        }
        if (plVar3 != local_40) {
          operator_delete(plVar3,local_40[0] + 1);
        }
        if (local_78 != local_68) {
          operator_delete(local_78,local_68[0] + 1);
        }
      }
LAB_00108547:
      uVar16 = uVar16 + 1;
    } while (uVar16 != (uVar4 & 0x7fffffff));
  }
  return bVar15;
}

Assistant:

static bool all_kv_in_other(const gguf_context * ctx, const gguf_context * other) {
    bool ok = true;

    const int n_kv = gguf_get_n_kv(ctx);
    for (int id = 0; id < n_kv; ++id) {
        const char * name = gguf_get_key(ctx, id);

        const int idx_other = gguf_find_key(other, name);
        if (idx_other < 0) {
            ok = false;
            continue;
        }

        const gguf_type type = gguf_get_kv_type(ctx, id);
        if (type != gguf_get_kv_type(other, idx_other)) {
            ok = false;
            continue;
        }

        if (type == GGUF_TYPE_ARRAY) {
            const size_t arr_n = gguf_get_arr_n(ctx, id);
            if (arr_n != gguf_get_arr_n(other, idx_other)) {
                ok = false;
                continue;
            }

            const gguf_type type_arr = gguf_get_arr_type(ctx, id);
            if (type_arr != gguf_get_arr_type(other, idx_other)) {
                ok = false;
                continue;
            }

            if (type_arr == GGUF_TYPE_BOOL) {
                const int8_t * data       = reinterpret_cast<const int8_t *>(gguf_get_arr_data(ctx,   id));
                const int8_t * data_other = reinterpret_cast<const int8_t *>(gguf_get_arr_data(other, idx_other));
                for (size_t arr_i = 0; arr_i < arr_n; ++arr_i) {
                    if (bool(data[arr_i]) != bool(data_other[arr_i])) {
                        ok = false;
                    }
                }
                continue;
            }

            if (type_arr == GGUF_TYPE_STRING) {
                for (size_t arr_i = 0; arr_i < arr_n; ++arr_i) {
                    const std::string str       = gguf_get_arr_str(ctx,   id,       arr_i);
                    const std::string str_other = gguf_get_arr_str(other, idx_other, arr_i);
                    if (str != str_other) {
                        ok = false;
                    }
                }
                continue;
            }

            const int8_t * data       = reinterpret_cast<const int8_t *>(gguf_get_arr_data(ctx,   id));
            const int8_t * data_other = reinterpret_cast<const int8_t *>(gguf_get_arr_data(other, idx_other));
            if (!std::equal(data, data + arr_n*gguf_type_size(type_arr), data_other)) {
                ok = false;
            }
            continue;
        }

        if (type == GGUF_TYPE_STRING) {
            const std::string str       = gguf_get_val_str(ctx,   id);
            const std::string str_other = gguf_get_val_str(other, idx_other);
            if (str != str_other) {
                ok = false;
            }
            continue;
        }

        const char * data       = reinterpret_cast<const char *>(gguf_get_val_data(ctx,   id));
        const char * data_other = reinterpret_cast<const char *>(gguf_get_val_data(other, idx_other));
        if (!std::equal(data, data + gguf_type_size(type), data_other)) {
            ok = false;
        }
    }

    return ok;
}